

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O0

bool __thiscall
S2MinDistanceShapeIndexTarget::VisitContainingShapes
          (S2MinDistanceShapeIndexTarget *this,S2ShapeIndex *query_index,ShapeVisitor *visitor)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  S2Shape *pSVar5;
  int extraout_var;
  ShapeIterator SVar6;
  ShapeIterator it;
  undefined1 local_158 [8];
  S2MinDistancePointTarget target_1;
  ReferencePoint ref;
  undefined1 local_108 [8];
  S2MinDistancePointTarget target;
  undefined1 auStack_b8 [8];
  S2Point v0;
  Chain chain;
  int c;
  bool tested_point;
  int num_chains;
  S2Shape *shape;
  ShapeIterator __end1;
  undefined1 local_40 [8];
  ShapeIterator __begin1;
  S2ShapeIndex *__range1;
  ShapeVisitor *visitor_local;
  S2ShapeIndex *query_index_local;
  S2MinDistanceShapeIndexTarget *this_local;
  
  __begin1._8_8_ = this->index_;
  SVar6 = S2ShapeIndex::begin((S2ShapeIndex *)__begin1._8_8_);
  local_40 = (undefined1  [8])SVar6.index_;
  __begin1.index_._0_4_ = SVar6.shape_id_;
  SVar6 = S2ShapeIndex::end((S2ShapeIndex *)__begin1._8_8_);
  while (it._12_4_ = 0, it.index_ = (S2ShapeIndex *)SUB128(SVar6._0_12_,0),
        it.shape_id_ = SUB124(SVar6._0_12_,8),
        bVar1 = S2ShapeIndex::ShapeIterator::operator!=((ShapeIterator *)local_40,it), bVar1) {
    pSVar5 = S2ShapeIndex::ShapeIterator::operator*((ShapeIterator *)local_40);
    if (pSVar5 != (S2Shape *)0x0) {
      iVar3 = (*pSVar5->_vptr_S2Shape[6])();
      bVar1 = false;
      for (chain.start = 0; chain.start < iVar3; chain.start = chain.start + 1) {
        iVar4 = (*pSVar5->_vptr_S2Shape[7])(pSVar5,(ulong)(uint)chain.start);
        register0x00000000 = CONCAT44(extraout_var,iVar4);
        if (extraout_var != 0) {
          bVar1 = true;
          (*pSVar5->_vptr_S2Shape[8])(target.point_.c_ + 2,pSVar5,(ulong)(uint)chain.start,0);
          auStack_b8 = (undefined1  [8])target.point_.c_[2];
          S2MinDistancePointTarget::S2MinDistancePointTarget
                    ((S2MinDistancePointTarget *)local_108,(S2Point *)auStack_b8);
          bVar2 = S2MinDistancePointTarget::VisitContainingShapes
                            ((S2MinDistancePointTarget *)local_108,query_index,visitor);
          if (!bVar2) {
            this_local._7_1_ = 0;
          }
          S2MinDistancePointTarget::~S2MinDistancePointTarget((S2MinDistancePointTarget *)local_108)
          ;
          if (!bVar2) goto LAB_004affa2;
        }
      }
      if ((!bVar1) &&
         ((*pSVar5->_vptr_S2Shape[5])(target_1.point_.c_ + 2), (ref.point.c_[2]._0_1_ & 1) != 0)) {
        S2MinDistancePointTarget::S2MinDistancePointTarget
                  ((S2MinDistancePointTarget *)local_158,(S2Point *)(target_1.point_.c_ + 2));
        bVar1 = S2MinDistancePointTarget::VisitContainingShapes
                          ((S2MinDistancePointTarget *)local_158,query_index,visitor);
        if (!bVar1) {
          this_local._7_1_ = 0;
        }
        S2MinDistancePointTarget::~S2MinDistancePointTarget((S2MinDistancePointTarget *)local_158);
        if (!bVar1) goto LAB_004affa2;
      }
    }
    S2ShapeIndex::ShapeIterator::operator++((ShapeIterator *)local_40);
  }
  this_local._7_1_ = 1;
LAB_004affa2:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool S2MinDistanceShapeIndexTarget::VisitContainingShapes(
    const S2ShapeIndex& query_index, const ShapeVisitor& visitor) {
  // It is sufficient to find the set of chain starts in the target index
  // (i.e., one vertex per connected component of edges) that are contained by
  // the query index, except for one special case to handle full polygons.
  //
  // TODO(ericv): Do this by merge-joining the two S2ShapeIndexes, and share
  // the code with S2BooleanOperation.

  for (S2Shape* shape : *index_) {
    if (shape == nullptr) continue;
    int num_chains = shape->num_chains();
    // Shapes that don't have any edges require a special case (below).
    bool tested_point = false;
    for (int c = 0; c < num_chains; ++c) {
      S2Shape::Chain chain = shape->chain(c);
      if (chain.length == 0) continue;
      tested_point = true;
      S2Point v0 = shape->chain_edge(c, 0).v0;
      S2MinDistancePointTarget target(v0);
      if (!target.VisitContainingShapes(query_index, visitor)) {
        return false;
      }
    }
    if (!tested_point) {
      // Special case to handle full polygons.
      S2Shape::ReferencePoint ref = shape->GetReferencePoint();
      if (!ref.contained) continue;
      S2MinDistancePointTarget target(ref.point);
      if (!target.VisitContainingShapes(query_index, visitor)) {
        return false;
      }
    }
  }
  return true;
}